

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::IsPeriodic(ON_NurbsCurve *this)

{
  bool bVar1;
  bool bVar2;
  double *local_38;
  double *cv1;
  double *cv0;
  int local_20;
  int i1;
  int i0;
  bool bIsPeriodic;
  ON_NurbsCurve *this_local;
  
  bVar1 = ON_IsKnotVectorPeriodic(this->m_order,this->m_cv_count,this->m_knot);
  if (bVar1) {
    local_20 = this->m_order + -2;
    cv1 = this->m_cv + local_20 * this->m_cv_stride;
    local_38 = this->m_cv + (this->m_cv_count + -1) * this->m_cv_stride;
    for (; -1 < local_20; local_20 = local_20 + -1) {
      bVar2 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,cv1,local_38);
      if (!bVar2) {
        return false;
      }
      cv1 = cv1 + -(long)this->m_cv_stride;
      local_38 = local_38 + -(long)this->m_cv_stride;
    }
  }
  return bVar1;
}

Assistant:

bool 
ON_NurbsCurve::IsPeriodic() const
{
  bool bIsPeriodic = ON_IsKnotVectorPeriodic( m_order, m_cv_count, m_knot );
  if ( bIsPeriodic ) {
    int i0 = m_order-2;
    int i1 = m_cv_count-1;
    const double* cv0 = m_cv + i0*m_cv_stride;
    const double* cv1 = m_cv + i1*m_cv_stride;
    for ( /*empty*/; i0 >= 0; i0--, i1-- ) {
      if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
        return false;
      cv0 -= m_cv_stride;
      cv1 -= m_cv_stride;      
    }
  }
  return bIsPeriodic;
}